

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation.cpp
# Opt level: O2

uint32_t icu_63::Collation::incThreeBytePrimaryByOffset
                   (uint32_t basePrimary,UBool isCompressible,int32_t offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  iVar1 = (basePrimary >> 8 & 0xff) + offset + -2;
  bVar4 = isCompressible == '\0';
  iVar3 = (uint)bVar4 * 3 + 0xfb;
  iVar2 = iVar1 / 0xfe + (basePrimary >> 0x10 & 0xff) + (uint)bVar4 * 2 + -4;
  return (iVar2 / iVar3) * 0x1000000 + (basePrimary & 0xff000000) |
         (iVar1 % 0xfe) * 0x100 + 0x200U |
         (iVar2 % iVar3) * 0x10000 + (uint)!bVar4 * 0x20000 + 0x20000;
}

Assistant:

uint32_t
Collation::incThreeBytePrimaryByOffset(uint32_t basePrimary, UBool isCompressible, int32_t offset) {
    // Extract the third byte, minus the minimum byte value,
    // plus the offset, modulo the number of usable byte values, plus the minimum.
    offset += ((int32_t)(basePrimary >> 8) & 0xff) - 2;
    uint32_t primary = (uint32_t)((offset % 254) + 2) << 8;
    offset /= 254;
    // Same with the second byte,
    // but reserve the PRIMARY_COMPRESSION_LOW_BYTE and high byte if necessary.
    if(isCompressible) {
        offset += ((int32_t)(basePrimary >> 16) & 0xff) - 4;
        primary |= (uint32_t)((offset % 251) + 4) << 16;
        offset /= 251;
    } else {
        offset += ((int32_t)(basePrimary >> 16) & 0xff) - 2;
        primary |= (uint32_t)((offset % 254) + 2) << 16;
        offset /= 254;
    }
    // First byte, assume no further overflow.
    return primary | ((basePrimary & 0xff000000) + (uint32_t)(offset << 24));
}